

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O0

bool __thiscall
Diligent::ShaderVariableIndexLocator::TryResource<Diligent::ShaderVariableManagerGL::ImageBindInfo>
          (ShaderVariableIndexLocator *this,Uint32 NextResourceTypeOffset,Uint32 VarCount)

{
  size_t sVar1;
  OffsetType OVar2;
  Char *pCVar3;
  char (*in_R8) [2];
  undefined1 local_80 [8];
  string msg_1;
  char local_50 [8];
  undefined1 local_48 [8];
  string msg;
  size_t RelativeOffset;
  Uint32 VarCount_local;
  Uint32 NextResourceTypeOffset_local;
  ShaderVariableIndexLocator *this_local;
  
  if (this->VarOffset < (ulong)NextResourceTypeOffset) {
    sVar1 = this->VarOffset;
    OVar2 = ShaderVariableManagerGL::
            GetResourceOffset<Diligent::ShaderVariableManagerGL::ImageBindInfo>(this->Mgr);
    msg.field_2._8_8_ = sVar1 - OVar2;
    if ((ulong)msg.field_2._8_8_ % 0x18 != 0) {
      local_50[0] = '\x18';
      local_50[1] = '\0';
      local_50[2] = '\0';
      local_50[3] = '\0';
      local_50[4] = '\0';
      local_50[5] = '\0';
      local_50[6] = '\0';
      local_50[7] = '\0';
      FormatString<char[42],unsigned_long,char[2]>
                ((string *)local_48,(Diligent *)"Offset is not multiple of resource type (",
                 (char (*) [42])local_50,(unsigned_long *)0x46d916,in_R8);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"TryResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                 ,0x225);
      std::__cxx11::string::~string((string *)local_48);
    }
    msg.field_2._8_8_ = msg.field_2._8_8_ / 0x18;
    if ((ulong)VarCount <= (ulong)msg.field_2._8_8_) {
      FormatString<char[131]>
                ((string *)local_80,
                 (char (*) [131])
                 "Relative offset is out of bounds which either means the variable does not belong to this SRB or there is a bug in variable offsets"
                );
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"TryResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                 ,0x229);
      std::__cxx11::string::~string((string *)local_80);
    }
    this->Index = (int)msg.field_2._8_8_ + this->Index;
    this_local._7_1_ = true;
  }
  else {
    this->Index = VarCount + this->Index;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TryResource(Uint32 NextResourceTypeOffset, Uint32 VarCount)
    {
        if (VarOffset < NextResourceTypeOffset)
        {
            auto RelativeOffset = VarOffset - Mgr.GetResourceOffset<ResourceType>();
            DEV_CHECK_ERR(RelativeOffset % sizeof(ResourceType) == 0, "Offset is not multiple of resource type (", sizeof(ResourceType), ")");
            RelativeOffset /= sizeof(ResourceType);
            VERIFY(RelativeOffset >= 0 && RelativeOffset < VarCount,
                   "Relative offset is out of bounds which either means the variable does not belong to this SRB or "
                   "there is a bug in variable offsets");
            Index += static_cast<Uint32>(RelativeOffset);
            return true;
        }
        else
        {
            Index += VarCount;
            return false;
        }
    }